

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O0

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,Access *access)

{
  int iVar1;
  ErrorReporter *pEVar2;
  SymbolTable *this_00;
  Type *type;
  bool bVar3;
  TokenType TVar4;
  uint uVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  string *field_00;
  allocator<char> local_109;
  string local_108;
  Entry *local_e8;
  Entry *field_;
  __shared_ptr_access<mcc::Literal,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_d0;
  shared_ptr<mcc::Literal> *field;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Access *local_18;
  Access *access_local;
  TypeChecker *this_local;
  
  local_18 = access;
  access_local = (Access *)this;
  peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &access->name_);
  peVar6->return_ptr_ = true;
  peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_18->name_);
  (*peVar6->_vptr_Expr[2])(peVar6,this);
  peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_18->name_);
  bVar3 = Type::IsStruct(&peVar6->type_);
  if (!bVar3) {
    peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_18->name_);
    bVar3 = Type::IsUnion(&peVar6->type_);
    if (!bVar3) {
      pEVar2 = this->reporter_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,
                 "Only struct/union fields can be accessed via \'.\' or \'->\' operator",&local_39);
      ErrorReporter::Report(pEVar2,&local_38,&(local_18->super_Expr).op_);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
    }
  }
  peVar7 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(local_18->super_Expr).op_);
  TVar4 = Token::GetType(peVar7);
  if (TVar4 == T_DOT) {
    peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_18->name_);
    if ((peVar6->type_).ind != 0) {
      pEVar2 = this->reporter_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Struct variable expected, but got pointer",&local_71);
      ErrorReporter::Report(pEVar2,&local_70,&(local_18->super_Expr).op_);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  peVar7 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(local_18->super_Expr).op_);
  TVar4 = Token::GetType(peVar7);
  if (TVar4 == T_ARROW) {
    peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_18->name_);
    if ((peVar6->type_).ind != 1) {
      pEVar2 = this->reporter_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Pointer to struct expected",&local_99);
      ErrorReporter::Report(pEVar2,&local_98,&(local_18->super_Expr).op_);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_18->field_);
  uVar5 = (*peVar6->_vptr_Expr[3])();
  if ((uVar5 & 1) == 0) {
    pEVar2 = this->reporter_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Only string fields are supported",
               (allocator<char> *)((long)&field + 7));
    peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_18->field_);
    ErrorReporter::Report(pEVar2,&local_c0,&peVar6->op_);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
  }
  (local_18->super_Expr).is_lvalue_ = true;
  std::static_pointer_cast<mcc::Literal,mcc::Expr>((shared_ptr<mcc::Expr> *)&field_);
  this_00 = this->symbol_table_;
  local_d0 = (__shared_ptr_access<mcc::Literal,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&field_;
  peVar6 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_18->name_);
  peVar8 = std::__shared_ptr_access<mcc::Literal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_d0);
  peVar7 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(peVar8->super_Expr).op_);
  field_00 = Token::String_abi_cxx11_(peVar7);
  local_e8 = SymbolTable::GetField(this_00,&peVar6->type_,field_00);
  if (local_e8 == (Entry *)0x0) {
    pEVar2 = this->reporter_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Undefined field",&local_109);
    peVar8 = std::__shared_ptr_access<mcc::Literal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_d0);
    ErrorReporter::Report(pEVar2,&local_108,&(peVar8->super_Expr).op_);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  else {
    Type::operator=(&(local_18->super_Expr).type_,local_e8->type);
    type = local_e8->type;
    peVar8 = std::__shared_ptr_access<mcc::Literal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_d0);
    Type::operator=(&(peVar8->super_Expr).type_,type);
    iVar1 = local_e8->offset;
    peVar8 = std::__shared_ptr_access<mcc::Literal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_d0);
    (peVar8->super_Expr).offset_ = iVar1;
  }
  std::shared_ptr<mcc::Literal>::~shared_ptr((shared_ptr<mcc::Literal> *)&field_);
  return;
}

Assistant:

void TypeChecker::Visit(Access& access) {
  access.name_->return_ptr_ = true;
  access.name_->Accept(*this);

  if (!access.name_->type_.IsStruct() && !access.name_->type_.IsUnion()) {
    reporter_.Report("Only struct/union fields can be accessed via '.' or '->' operator", access.op_);
  }

  if (access.op_->GetType() == TokenType::T_DOT && access.name_->type_.ind != 0) {
    reporter_.Report("Struct variable expected, but got pointer", access.op_);
  }

  if (access.op_->GetType() == TokenType::T_ARROW && access.name_->type_.ind != 1) {
    reporter_.Report("Pointer to struct expected", access.op_);
  }

  if (!access.field_->IsVariable()) {
    reporter_.Report("Only string fields are supported", access.field_->op_);
  }

  access.is_lvalue_ = true;
  const std::shared_ptr<Literal>& field = std::static_pointer_cast<Literal>(access.field_);
  Entry* field_ = symbol_table_.GetField(access.name_->type_, field->op_->String());

  if (field_ == nullptr) {
    reporter_.Report("Undefined field", field->op_);
    return;
  }

  access.type_ = *field_->type;
  field->type_ = *field_->type;
  field->offset_ = field_->offset; // annotate node with offset value
}